

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O3

MPP_RET mpp_buffer_group_limit_config(MppBufferGroup group,size_t size,RK_S32 count)

{
  MPP_RET MVar1;
  
  if (group == (MppBufferGroup)0x0) {
    _mpp_log_l(2,"mpp_buffer","input invalid group %p\n","mpp_buffer_group_limit_config",0);
    MVar1 = MPP_NOK;
  }
  else {
    if (*(int *)((long)group + 0x48) != 0) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "p->mode == MPP_BUFFER_INTERNAL","mpp_buffer_group_limit_config",0x1be);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    *(size_t *)((long)group + 0x68) = size;
    *(RK_S32 *)((long)group + 0x70) = count;
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buffer_group_limit_config(MppBufferGroup group, size_t size, RK_S32 count)
{
    if (NULL == group) {
        mpp_err_f("input invalid group %p\n", group);
        return MPP_NOK;
    }

    MppBufferGroupImpl *p = (MppBufferGroupImpl *)group;
    mpp_assert(p->mode == MPP_BUFFER_INTERNAL);
    p->limit_size     = size;
    p->limit_count    = count;
    return MPP_OK;
}